

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

char * __thiscall FBehavior::LookupString(FBehavior *this,DWORD index)

{
  uint uVar1;
  uint *puVar2;
  DWORD *list;
  uint *puVar3;
  int iVar4;
  
  list = (DWORD *)(ulong)this->StringTable;
  if (list != (DWORD *)0x0) {
    puVar3 = (uint *)((long)list + (long)this->Data);
    if (this->Format == ACS_Old) {
      iVar4 = 1;
      uVar1 = *puVar3;
      puVar2 = (uint *)this->Data;
    }
    else {
      iVar4 = 3;
      uVar1 = puVar3[1];
      puVar2 = puVar3;
    }
    if (index < uVar1) {
      return (char *)((ulong)puVar3[iVar4 + index] + (long)puVar2);
    }
  }
  return (char *)0x0;
}

Assistant:

const char *FBehavior::LookupString (DWORD index) const
{
	if (StringTable == 0)
	{
		return NULL;
	}
	if (Format == ACS_Old)
	{
		DWORD *list = (DWORD *)(Data + StringTable);

		if (index >= list[0])
			return NULL;	// Out of range for this list;
		return (const char *)(Data + list[1+index]);
	}
	else
	{
		DWORD *list = (DWORD *)(Data + StringTable);

		if (index >= list[1])
			return NULL;	// Out of range for this list
		return (const char *)(Data + StringTable + list[3+index]);
	}
}